

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

void Curl_conncache_remove_conn(Curl_easy *data,connectdata *conn,_Bool lock)

{
  connectbundle *bundle;
  conncache *hash;
  Curl_hash_element *pCVar1;
  Curl_hash_iterator iter;
  Curl_hash_iterator CStack_48;
  
  bundle = conn->bundle;
  if (bundle != (connectbundle *)0x0) {
    hash = (data->state).conn_cache;
    if ((lock) && (data->share != (Curl_share *)0x0)) {
      Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    bundle_remove_conn(bundle,conn);
    if ((bundle->num_connections == 0) && (hash != (conncache *)0x0)) {
      Curl_hash_start_iterate(&hash->hash,&CStack_48);
      pCVar1 = Curl_hash_next_element(&CStack_48);
      while (pCVar1 != (Curl_hash_element *)0x0) {
        if ((connectbundle *)pCVar1->ptr == bundle) {
          Curl_hash_delete(&hash->hash,pCVar1->key,pCVar1->key_len);
          break;
        }
        pCVar1 = Curl_hash_next_element(&CStack_48);
      }
    }
    conn->bundle = (connectbundle *)0x0;
    if (hash != (conncache *)0x0) {
      hash->num_conn = hash->num_conn - 1;
    }
    if ((lock) && (data->share != (Curl_share *)0x0)) {
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
    }
  }
  return;
}

Assistant:

void Curl_conncache_remove_conn(struct Curl_easy *data,
                                struct connectdata *conn, bool lock)
{
  struct connectbundle *bundle = conn->bundle;
  struct conncache *connc = data->state.conn_cache;

  /* The bundle pointer can be NULL, since this function can be called
     due to a failed connection attempt, before being added to a bundle */
  if(bundle) {
    if(lock) {
      CONNCACHE_LOCK(data);
    }
    bundle_remove_conn(bundle, conn);
    if(bundle->num_connections == 0)
      conncache_remove_bundle(connc, bundle);
    conn->bundle = NULL; /* removed from it */
    if(connc) {
      connc->num_conn--;
      DEBUGF(infof(data, "The cache now contains %zu members\n",
                   connc->num_conn));
    }
    if(lock) {
      CONNCACHE_UNLOCK(data);
    }
  }
}